

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::ListFields
          (Reflection *this,Message *message,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  uint uVar1;
  uint uVar2;
  pointer ppFVar3;
  uint32 *puVar4;
  long lVar5;
  long lVar6;
  pointer ppFVar7;
  bool bVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int i;
  long lVar12;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __i;
  pointer ppFVar13;
  FieldDescriptor *field;
  
  ppFVar3 = (output->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((output->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar3) {
    (output->
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppFVar3;
  }
  if ((this->schema_).default_instance_ != message) {
    uVar1 = (this->schema_).has_bits_offset_;
    puVar4 = (this->schema_).has_bit_indices_;
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::reserve(output,(long)*(int *)(this->descriptor_ + 0x68));
    lVar11 = 0;
    for (lVar12 = 0; lVar12 <= this->last_non_weak_field_index_; lVar12 = lVar12 + 1) {
      lVar5 = *(long *)(this->descriptor_ + 0x28);
      field = (FieldDescriptor *)(lVar5 + lVar11);
      if (*(int *)(lVar5 + 0x3c + lVar11) == 3) {
        iVar9 = FieldSize(this,message,field);
        if (0 < iVar9) goto LAB_0035f474;
      }
      else {
        lVar6 = *(long *)(lVar5 + 0x58 + lVar11);
        if (lVar6 == 0) {
          if (uVar1 == 0xffffffff) {
            bVar8 = HasBit(this,message,field);
            if (bVar8) goto LAB_0035f474;
          }
          else {
            uVar2 = puVar4[lVar12];
            if ((*(uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                          (ulong)(uVar2 >> 5) * 4 + (ulong)uVar1) >> (uVar2 & 0x1f) & 1) != 0) {
LAB_0035f474:
              std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::push_back(output,&field);
            }
          }
        }
        else if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                         (long)(int)((lVar6 - *(long *)(*(long *)(lVar6 + 0x10) + 0x30)) / 0x30) * 4
                         + (ulong)(uint)(this->schema_).oneof_case_offset_) ==
                 *(int *)(lVar5 + 0x44 + lVar11)) goto LAB_0035f474;
      }
      lVar11 = lVar11 + 0x98;
    }
    uVar10 = (ulong)(uint)(this->schema_).extensions_offset_;
    if (uVar10 != 0xffffffff) {
      internal::ExtensionSet::AppendToList
                ((ExtensionSet *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar10),
                 this->descriptor_,this->descriptor_pool_,output);
    }
    ppFVar3 = (output->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppFVar7 = (output->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar3 != ppFVar7) {
      uVar10 = (long)ppFVar7 - (long)ppFVar3 >> 3;
      lVar11 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                (ppFVar3,ppFVar7,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppFVar7 - (long)ppFVar3 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                  (ppFVar3,ppFVar7);
      }
      else {
        ppFVar13 = ppFVar3 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                  (ppFVar3,ppFVar13);
        for (; ppFVar13 != ppFVar7; ppFVar13 = ppFVar13 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                    (ppFVar13);
        }
      }
    }
  }
  return;
}

Assistant:

void Reflection::ListFields(const Message& message,
                            std::vector<const FieldDescriptor*>* output) const {
  output->clear();

  // Optimization:  The default instance never has any fields set.
  if (schema_.IsDefaultInstance(message)) return;

  // Optimization: Avoid calling GetHasBits() and HasOneofField() many times
  // within the field loop.  We allow this violation of ReflectionSchema
  // encapsulation because this function takes a noticable about of CPU
  // fleetwide and properly allowing this optimization through public interfaces
  // seems more trouble than it is worth.
  const uint32* const has_bits =
      schema_.HasHasbits() ? GetHasBits(message) : nullptr;
  const uint32* const has_bits_indices = schema_.has_bit_indices_;
  output->reserve(descriptor_->field_count());
  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      if (FieldSize(message, field) > 0) {
        output->push_back(field);
      }
    } else {
      const OneofDescriptor* containing_oneof = field->containing_oneof();
      if (containing_oneof) {
        const uint32* const oneof_case_array = GetConstPointerAtOffset<uint32>(
            &message, schema_.oneof_case_offset_);
        // Equivalent to: HasOneofField(message, field)
        if (oneof_case_array[containing_oneof->index()] == field->number()) {
          output->push_back(field);
        }
      } else if (has_bits) {
        // Equivalent to: HasBit(message, field)
        if (IsIndexInHasBitSet(has_bits, has_bits_indices[i])) {
          output->push_back(field);
        }
      } else if (HasBit(message, field)) {  // Fall back on proto3-style HasBit.
        output->push_back(field);
      }
    }
  }
  if (schema_.HasExtensionSet()) {
    GetExtensionSet(message).AppendToList(descriptor_, descriptor_pool_,
                                          output);
  }

  // ListFields() must sort output by field number.
  std::sort(output->begin(), output->end(), FieldNumberSorter());
}